

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

uint64_t nn_get_statistic(int s,int statistic)

{
  int iVar1;
  int *piVar2;
  uint64_t local_30;
  uint64_t val;
  nn_sock *sock;
  int local_18;
  int rc;
  int statistic_local;
  int s_local;
  
  local_18 = statistic;
  rc = s;
  sock._4_4_ = nn_global_hold_socket((nn_sock **)&val,s);
  if (sock._4_4_ < 0) {
    iVar1 = -sock._4_4_;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    _statistic_local = 0xffffffffffffffff;
  }
  else {
    if (local_18 == 0x65) {
      local_30 = *(uint64_t *)(val + 400);
    }
    else if (local_18 == 0x66) {
      local_30 = *(uint64_t *)(val + 0x198);
    }
    else if (local_18 == 0x67) {
      local_30 = *(uint64_t *)(val + 0x1a0);
    }
    else if (local_18 == 0x68) {
      local_30 = *(uint64_t *)(val + 0x1a8);
    }
    else if (local_18 == 0x69) {
      local_30 = *(uint64_t *)(val + 0x1b0);
    }
    else if (local_18 == 0x6a) {
      local_30 = *(uint64_t *)(val + 0x1b8);
    }
    else if (local_18 == 0x6b) {
      local_30 = *(uint64_t *)(val + 0x1b8);
    }
    else if (local_18 == 0xc9) {
      local_30 = (uint64_t)*(int *)(val + 0x1e8);
    }
    else if (local_18 == 0xca) {
      local_30 = (uint64_t)*(int *)(val + 0x1ec);
    }
    else if (local_18 == 0xcb) {
      local_30 = (uint64_t)*(int *)(val + 500);
    }
    else if (local_18 == 0x12d) {
      local_30 = *(uint64_t *)(val + 0x1c8);
    }
    else if (local_18 == 0x12e) {
      local_30 = *(uint64_t *)(val + 0x1d0);
    }
    else if (local_18 == 0x12f) {
      local_30 = *(uint64_t *)(val + 0x1d8);
    }
    else if (local_18 == 0x130) {
      local_30 = *(uint64_t *)(val + 0x1e0);
    }
    else if (local_18 == 0x191) {
      local_30 = (uint64_t)*(int *)(val + 0x1f0);
    }
    else {
      local_30 = 0xffffffffffffffff;
      piVar2 = __errno_location();
      *piVar2 = 0x16;
    }
    nn_global_rele_socket((nn_sock *)val);
    _statistic_local = local_30;
  }
  return _statistic_local;
}

Assistant:

uint64_t nn_get_statistic (int s, int statistic)
{
    int rc;
    struct nn_sock *sock;
    uint64_t val;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return (uint64_t)-1;
    }

    switch (statistic) {
    case NN_STAT_ESTABLISHED_CONNECTIONS:
        val = sock->statistics.established_connections;
        break;
    case NN_STAT_ACCEPTED_CONNECTIONS:
        val = sock->statistics.accepted_connections;
        break;
    case NN_STAT_DROPPED_CONNECTIONS:
        val = sock->statistics.dropped_connections;
        break;
    case NN_STAT_BROKEN_CONNECTIONS:
        val = sock->statistics.broken_connections;
        break;
    case NN_STAT_CONNECT_ERRORS:
        val = sock->statistics.connect_errors;
        break;
    case NN_STAT_BIND_ERRORS:
        val = sock->statistics.bind_errors;
        break;
    case NN_STAT_ACCEPT_ERRORS:
        val = sock->statistics.bind_errors;
        break;
    case NN_STAT_MESSAGES_SENT:
        val = sock->statistics.messages_sent;
        break;
    case NN_STAT_MESSAGES_RECEIVED:
        val = sock->statistics.messages_received;
        break;
    case NN_STAT_BYTES_SENT:
        val = sock->statistics.bytes_sent;
        break;
    case NN_STAT_BYTES_RECEIVED:
        val = sock->statistics.bytes_received;
        break;
    case NN_STAT_CURRENT_CONNECTIONS:
        val = sock->statistics.current_connections;
        break;
    case NN_STAT_INPROGRESS_CONNECTIONS:
        val = sock->statistics.inprogress_connections;
        break;
    case NN_STAT_CURRENT_SND_PRIORITY:
        val = sock->statistics.current_snd_priority;
        break;
    case NN_STAT_CURRENT_EP_ERRORS:
        val = sock->statistics.current_ep_errors;
        break;
    default:
        val = (uint64_t)-1;
        errno = EINVAL;
        break;
    }

    nn_global_rele_socket (sock);
    return val;
}